

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall helics::CoreBroker::disconnect(CoreBroker *this)

{
  BrokerBase *this_00;
  GlobalFederateId GVar1;
  pointer pcVar2;
  size_type sVar3;
  string_view message;
  string_view message_00;
  string_view message_01;
  bool bVar4;
  string *__rhs;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar5;
  ulong uVar6;
  string_view fmt;
  format_args args;
  string_view name;
  string_view name_00;
  string_view name_01;
  int local_144;
  __atomic_base<unsigned_long> local_f8 [2];
  char *local_e8;
  size_t local_e0;
  
  this_00 = &this->super_BrokerBase;
  ActionMessage::ActionMessage((ActionMessage *)&local_e8,cmd_user_disconnect);
  BrokerBase::addActionMessage(this_00,(ActionMessage *)&local_e8);
  ActionMessage::~ActionMessage((ActionMessage *)&local_e8);
  local_144 = -1;
  uVar6 = 1;
  do {
    bVar4 = waitForDisconnect(this,(milliseconds)0xc8);
    if (bVar4) {
      return;
    }
    GVar1.gid = (this->super_BrokerBase).global_id._M_i.gid;
    pcVar2 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
    sVar3 = (this->super_BrokerBase).identifier._M_string_length;
    __rhs = brokerStateName_abi_cxx11_((this->super_BrokerBase).brokerState._M_i);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8,
                   "waiting on disconnect: current state=",__rhs);
    aVar5.values_ = (value<fmt::v11::context> *)0x0;
    message._M_str = local_e8;
    message._M_len = local_e0;
    name._M_str = pcVar2;
    name._M_len = sVar3;
    BrokerBase::sendToLogger(this_00,GVar1,3,name,message,false);
    std::__cxx11::string::~string((string *)&local_e8);
    if ((uVar6 & 3) == 0) {
      GVar1.gid = (this->super_BrokerBase).global_id._M_i.gid;
      pcVar2 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      sVar3 = (this->super_BrokerBase).identifier._M_string_length;
      if (((this->super_BrokerBase).mainLoopIsRunning._M_base._M_i & 1U) == 0) {
        message_01._M_str =
             "main loop is stopped but have not received disconnect notice, assuming disconnected";
        message_01._M_len = 0x53;
        name_01._M_str = pcVar2;
        name_01._M_len = sVar3;
        BrokerBase::sendToLogger(this_00,GVar1,3,name_01,message_01,false);
        return;
      }
      local_f8[0]._M_i =
           (this->super_BrokerBase).messageCounter.super___atomic_base<unsigned_long>._M_i;
      fmt.size_ = 4;
      fmt.data_ = (char *)0x32;
      args.field_1.values_ = aVar5.values_;
      args.desc_ = (unsigned_long_long)local_f8;
      ::fmt::v11::vformat_abi_cxx11_
                ((string *)&local_e8,(v11 *)"sending disconnect again; total message count = {}",fmt
                 ,args);
      message_00._M_str = local_e8;
      message_00._M_len = local_e0;
      name_00._M_str = pcVar2;
      name_00._M_len = sVar3;
      BrokerBase::sendToLogger(this_00,GVar1,3,name_00,message_00,false);
      std::__cxx11::string::~string((string *)&local_e8);
      ActionMessage::ActionMessage((ActionMessage *)&local_e8,cmd_user_disconnect);
      BrokerBase::addActionMessage(this_00,(ActionMessage *)&local_e8);
      ActionMessage::~ActionMessage((ActionMessage *)&local_e8);
    }
    if ((int)(uVar6 / 0xd) * 0xd + local_144 == 0) {
      std::operator<<((ostream *)&std::cerr,"waiting on disconnect\n");
    }
    local_144 = local_144 + -1;
    uVar6 = (ulong)((int)uVar6 + 1);
  } while( true );
}

Assistant:

void CoreBroker::disconnect()
{
    addActionMessage(CMD_USER_DISCONNECT);
    int cnt{0};
    while (!waitForDisconnect(std::chrono::milliseconds(200))) {
        ++cnt;
        LOG_WARNING(global_id.load(),
                    getIdentifier(),
                    "waiting on disconnect: current state=" + brokerStateName(getBrokerState()));
        if (cnt % 4 == 0) {
            if (!isRunning()) {
                LOG_WARNING(
                    global_id.load(),
                    getIdentifier(),
                    "main loop is stopped but have not received disconnect notice, assuming disconnected");
                return;
            }
            LOG_WARNING(global_id.load(),
                        getIdentifier(),
                        fmt::format("sending disconnect again; total message count = {}",
                                    currentMessageCounter()));
            addActionMessage(CMD_USER_DISCONNECT);
        }
        if (cnt % 13 == 0) {
            std::cerr << "waiting on disconnect\n";
        }
    }
}